

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O3

int vorbis_book_init_decode(codebook *c,static_codebook *s)

{
  long *plVar1;
  long lVar2;
  size_t __size;
  static_codebook *b;
  ogg_uint32_t *poVar3;
  ogg_uint32_t *poVar4;
  ogg_int32_t *poVar5;
  int *piVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  void *__base;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int *sparsemap;
  char **ppcVar22;
  codebook *pcVar23;
  uint uVar24;
  int aiStack_50 [2];
  size_t local_48;
  static_codebook *local_40;
  codebook *local_38;
  
  c->q_min = 0;
  c->q_delta = 0;
  c->dec_firsttable = (ogg_uint32_t *)0x0;
  c->dec_firsttablen = 0;
  c->dec_maxlength = 0;
  c->dec_index = (int *)0x0;
  c->dec_codelengths = (char *)0x0;
  c->valuelist = (ogg_int32_t *)0x0;
  c->codelist = (ogg_uint32_t *)0x0;
  c->used_entries = 0;
  *(undefined8 *)&c->binarypoint = 0;
  c->dim = 0;
  c->entries = 0;
  lVar14 = s->entries;
  if (lVar14 < 1) {
    c->entries = lVar14;
    c->used_entries = 0;
    c->dim = s->dim;
  }
  else {
    lVar11 = 0;
    uVar24 = 0;
    do {
      uVar24 = uVar24 + (0 < s->lengthlist[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar14 != lVar11);
    c->entries = lVar14;
    uVar16 = (ulong)uVar24;
    c->used_entries = uVar16;
    c->dim = s->dim;
    if (uVar24 != 0) {
      aiStack_50[0] = 0x1348be;
      aiStack_50[1] = 0;
      local_40 = s;
      poVar3 = _make_words(s->lengthlist,lVar14,uVar16);
      lVar14 = -(uVar16 * 8 + 0xf & 0xfffffffffffffff0);
      __base = (void *)((long)&local_48 + lVar14);
      if (poVar3 == (ogg_uint32_t *)0x0) {
        *(undefined8 *)((long)aiStack_50 + lVar14) = 0x134a96;
        vorbis_book_clear(c);
        return -1;
      }
      lVar11 = 0;
      local_38 = c;
      do {
        uVar19 = *(uint *)((long)poVar3 + lVar11);
        uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18
        ;
        uVar19 = (uVar19 & 0xf0f0f0f) << 4 | uVar19 >> 4 & 0xf0f0f0f;
        uVar19 = (uVar19 >> 2 & 0x33333333) + (uVar19 & 0x33333333) * 4;
        *(uint *)((long)poVar3 + lVar11) = (uVar19 >> 1 & 0x55555555) + (uVar19 & 0x55555555) * 2;
        *(long *)((long)__base + lVar11 * 2) = (long)poVar3 + lVar11;
        lVar11 = lVar11 + 4;
      } while (uVar16 * 4 - lVar11 != 0);
      *(undefined8 *)((long)aiStack_50 + lVar14) = 0x134964;
      qsort(__base,uVar16,8,sort32a);
      sparsemap = (int *)((long)__base - (uVar16 * 4 + 0xf & 0xfffffffffffffff0));
      local_48 = uVar16 * 4;
      sparsemap[-2] = 0x13498a;
      sparsemap[-1] = 0;
      poVar4 = (ogg_uint32_t *)malloc(uVar16 * 4);
      local_38->codelist = poVar4;
      uVar12 = 0;
      do {
        sparsemap[(int)((ulong)(*(long *)((long)__base + uVar12 * 8) - (long)poVar3) >> 2)] =
             (int)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar16 != uVar12);
      uVar12 = 0;
      do {
        poVar4[sparsemap[uVar12]] = poVar3[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar16 != uVar12);
      sparsemap[-2] = 0x1349cb;
      sparsemap[-1] = 0;
      free(poVar3);
      pcVar23 = local_38;
      b = local_40;
      piVar6 = &local_38->binarypoint;
      sparsemap[-2] = 0x1349e5;
      sparsemap[-1] = 0;
      poVar5 = _book_unquantize(b,uVar24,sparsemap,piVar6);
      __size = local_48;
      pcVar23->valuelist = poVar5;
      sparsemap[-2] = 0x1349f2;
      sparsemap[-1] = 0;
      piVar6 = (int *)malloc(__size);
      pcVar23->dec_index = piVar6;
      lVar14 = b->entries;
      if (lVar14 < 1) {
        uVar24 = 0;
        sparsemap[-2] = 0x134aa9;
        sparsemap[-1] = 0;
        pcVar7 = (char *)malloc(0);
        ppcVar22 = &pcVar23->dec_codelengths;
        pcVar23->dec_codelengths = pcVar7;
      }
      else {
        plVar1 = b->lengthlist;
        lVar11 = 0;
        iVar13 = 0;
        do {
          if (0 < plVar1[lVar11]) {
            lVar15 = (long)iVar13;
            iVar13 = iVar13 + 1;
            piVar6[sparsemap[lVar15]] = (int)lVar11;
          }
          lVar11 = lVar11 + 1;
        } while (lVar14 != lVar11);
        sparsemap[-2] = 0x134a2e;
        sparsemap[-1] = 0;
        pcVar7 = (char *)malloc((long)iVar13);
        ppcVar22 = &local_38->dec_codelengths;
        local_38->dec_codelengths = pcVar7;
        pcVar23 = local_38;
        if (lVar14 < 1) {
          uVar24 = 0;
        }
        else {
          lVar11 = 0;
          uVar24 = 0;
          do {
            if (0 < local_40->lengthlist[lVar11]) {
              lVar14 = (long)(int)uVar24;
              uVar24 = uVar24 + 1;
              (*ppcVar22)[sparsemap[lVar14]] = (char)local_40->lengthlist[lVar11];
              lVar14 = local_40->entries;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < lVar14);
        }
      }
      uVar19 = (uint)pcVar23->used_entries;
      uVar9 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) + 0x21;
      if (uVar19 == 0) {
        uVar9 = 0;
      }
      uVar19 = 0xc;
      if (uVar9 < 0xc) {
        uVar19 = uVar9;
      }
      iVar13 = 5;
      if (8 < uVar9) {
        iVar13 = uVar19 - 4;
      }
      pcVar23->dec_firsttablen = iVar13;
      bVar8 = (byte)iVar13;
      uVar16 = (ulong)(uint)(1 << (bVar8 & 0x1f));
      local_40 = (static_codebook *)uVar16;
      sparsemap[-2] = 0x134b05;
      sparsemap[-1] = 0;
      poVar3 = (ogg_uint32_t *)calloc(uVar16,4);
      pcVar23->dec_firsttable = poVar3;
      pcVar23->dec_maxlength = 0;
      if (0 < (int)uVar24) {
        pcVar7 = *ppcVar22;
        uVar16 = 0;
        iVar21 = 0;
        do {
          iVar10 = (int)pcVar7[uVar16];
          if (iVar21 < iVar10) {
            local_38->dec_maxlength = iVar10;
            iVar21 = iVar10;
            iVar10 = (int)pcVar7[uVar16];
          }
          if ((iVar10 <= iVar13) && (iVar13 - iVar10 != 0x1f)) {
            uVar19 = local_38->codelist[uVar16];
            uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                     uVar19 << 0x18;
            uVar19 = (uVar19 & 0xf0f0f0f) << 4 | uVar19 >> 4 & 0xf0f0f0f;
            uVar19 = (uVar19 >> 2 & 0x33333333) + (uVar19 & 0x33333333) * 4;
            iVar20 = 0;
            do {
              poVar3[iVar20 << ((byte)iVar10 & 0x1f) |
                     (uVar19 >> 1 & 0x55555555) + (uVar19 & 0x55555555) * 2] = (int)uVar16 + 1;
              iVar20 = iVar20 + 1;
              iVar10 = (int)pcVar7[uVar16];
            } while (iVar20 < 1 << (bVar8 - pcVar7[uVar16] & 0x1f));
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar24);
      }
      lVar11 = (long)(int)uVar24;
      iVar13 = 0;
      uVar16 = 0;
      lVar14 = 0;
      do {
        uVar19 = iVar13 << (0x20 - bVar8 & 0x1f);
        uVar24 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18
        ;
        uVar24 = (uVar24 & 0xf0f0f0f) << 4 | uVar24 >> 4 & 0xf0f0f0f;
        uVar24 = (uVar24 >> 2 & 0x33333333) + (uVar24 & 0x33333333) * 4;
        uVar24 = (uVar24 >> 1 & 0x55555555) + (uVar24 & 0x55555555) * 2;
        lVar15 = lVar14;
        if (poVar3[uVar24] == 0) {
          lVar17 = uVar16 + 1;
          if ((long)(uVar16 + 1) <= lVar11) {
            lVar17 = lVar11;
          }
          uVar12 = uVar16 - 1;
          do {
            uVar16 = lVar17 - 1;
            if ((1 - lVar17) + uVar12 == -1) break;
            uVar16 = uVar12 + 1;
            lVar2 = uVar12 + 2;
            uVar12 = uVar16;
          } while (local_38->codelist[lVar2] <= uVar19);
          if (lVar14 < lVar11) {
            do {
              lVar15 = lVar14;
              if (uVar19 < (local_38->codelist[lVar14] &
                           (uint)(0xfffffffeL << (0x1f - bVar8 & 0x3f)))) break;
              lVar14 = lVar14 + 1;
              lVar15 = lVar11;
            } while (lVar11 != lVar14);
          }
          uVar18 = lVar11 - lVar15;
          uVar12 = 0x7fff;
          if (uVar16 < 0x7fff) {
            uVar12 = uVar16;
          }
          if (0x7ffe < uVar18) {
            uVar18 = 0x7fff;
          }
          poVar3[uVar24] = (uint)uVar18 | (int)uVar12 << 0xf | 0x80000000;
        }
        iVar13 = iVar13 + 1;
        lVar14 = lVar15;
      } while (iVar13 != (int)local_40);
    }
  }
  return 0;
}

Assistant:

int vorbis_book_init_decode(codebook *c,const static_codebook *s){
  int i,j,n=0,tabn;
  int *sortindex;
  memset(c,0,sizeof(*c));
  
  /* count actually used entries */
  for(i=0;i<s->entries;i++)
    if(s->lengthlist[i]>0)
      n++;

  c->entries=s->entries;
  c->used_entries=n;
  c->dim=s->dim;

  if(n>0){
    /* two different remappings go on here.  
       
       First, we collapse the likely sparse codebook down only to
       actually represented values/words.  This collapsing needs to be
       indexed as map-valueless books are used to encode original entry
       positions as integers.
       
       Second, we reorder all vectors, including the entry index above,
       by sorted bitreversed codeword to allow treeless decode. */
    
    /* perform sort */
    ogg_uint32_t *codes=_make_words(s->lengthlist,s->entries,c->used_entries);
    ogg_uint32_t **codep=(ogg_uint32_t **)alloca(sizeof(*codep)*n);
    
    if(codes==NULL)goto err_out;

    for(i=0;i<n;i++){
      codes[i]=bitreverse(codes[i]);
      codep[i]=codes+i;
    }

    qsort(codep,n,sizeof(*codep),sort32a);

    sortindex=(int *)alloca(n*sizeof(*sortindex));
    c->codelist=(ogg_uint32_t *)_ogg_malloc(n*sizeof(*c->codelist));
    /* the index is a reverse index */
    for(i=0;i<n;i++){
      int position=codep[i]-codes;
      sortindex[position]=i;
    }

    for(i=0;i<n;i++)
      c->codelist[sortindex[i]]=codes[i];
    _ogg_free(codes);
    
    
    
    c->valuelist=_book_unquantize(s,n,sortindex,&c->binarypoint);
    c->dec_index=(int *)_ogg_malloc(n*sizeof(*c->dec_index));
    
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
	c->dec_index[sortindex[n++]]=i;
    
    c->dec_codelengths=(char *)_ogg_malloc(n*sizeof(*c->dec_codelengths));
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
	c->dec_codelengths[sortindex[n++]]=s->lengthlist[i];
    
    c->dec_firsttablen=_ilog(c->used_entries)-4; /* this is magic */
    if(c->dec_firsttablen<5)c->dec_firsttablen=5;
    if(c->dec_firsttablen>8)c->dec_firsttablen=8;
    
    tabn=1<<c->dec_firsttablen;
    c->dec_firsttable=(ogg_uint32_t *)_ogg_calloc(tabn,sizeof(*c->dec_firsttable));
    c->dec_maxlength=0;
    
    for(i=0;i<n;i++){
      if(c->dec_maxlength<c->dec_codelengths[i])
	c->dec_maxlength=c->dec_codelengths[i];
      if(c->dec_codelengths[i]<=c->dec_firsttablen){
	ogg_uint32_t orig=bitreverse(c->codelist[i]);
	for(j=0;j<(1<<(c->dec_firsttablen-c->dec_codelengths[i]));j++)
	  c->dec_firsttable[orig|(j<<c->dec_codelengths[i])]=i+1;
      }
    }
    
    /* now fill in 'unused' entries in the firsttable with hi/lo search
       hints for the non-direct-hits */
    {
      ogg_uint32_t mask=0xfffffffeUL<<(31-c->dec_firsttablen);
      long lo=0,hi=0;
      
      for(i=0;i<tabn;i++){
	ogg_uint32_t word=i<<(32-c->dec_firsttablen);
	if(c->dec_firsttable[bitreverse(word)]==0){
	  while((lo+1)<n && c->codelist[lo+1]<=word)lo++;
	  while(    hi<n && word>=(c->codelist[hi]&mask))hi++;
	  
	  /* we only actually have 15 bits per hint to play with here.
	     In order to overflow gracefully (nothing breaks, efficiency
	     just drops), encode as the difference from the extremes. */
	  {
	    unsigned long loval=lo;
	    unsigned long hival=n-hi;
	    
	    if(loval>0x7fff)loval=0x7fff;
	    if(hival>0x7fff)hival=0x7fff;
	    c->dec_firsttable[bitreverse(word)]=
	      0x80000000UL | (loval<<15) | hival;
	  }
	}
      }
    }
  }

  return(0);
 err_out:
  vorbis_book_clear(c);
  return(-1);
}